

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

HDRImageBuffer * load_exr(char *file_path)

{
  float fVar1;
  float fVar2;
  uchar *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  int iVar6;
  size_t sVar7;
  HDRImageBuffer *this;
  ostream *poVar8;
  long lVar9;
  float *pfVar10;
  char *err;
  EXRImage exr;
  char *local_1080;
  EXRImage local_1078;
  
  local_1078.images = (uchar **)0x0;
  local_1078.pixel_types = (int *)0x0;
  local_1078.num_custom_attributes = 0;
  local_1078.num_channels = 0;
  local_1078.channel_names = (char **)0x0;
  local_1078.requested_pixel_types = (int *)0x0;
  iVar6 = ParseMultiChannelEXRHeaderFromFile(&local_1078,file_path,&local_1080);
  if (iVar6 == 0) {
    if (0 < local_1078.num_channels) {
      lVar9 = 0;
      do {
        if (local_1078.pixel_types[lVar9] == 1) {
          local_1078.requested_pixel_types[lVar9] = 2;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < local_1078.num_channels);
    }
    iVar6 = LoadMultiChannelEXRFromFile(&local_1078,file_path,&local_1080);
    if (iVar6 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"[Scotty3D] ");
      poVar8 = std::operator<<(poVar8,"Error loading OpenEXR file: ");
      poVar8 = std::operator<<(poVar8,local_1080);
      std::endl<char,std::char_traits<char>>(poVar8);
      exit(1);
    }
    this = (HDRImageBuffer *)operator_new(0x28);
    this->w = 0;
    this->h = 0;
    (this->data).super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->data).super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->data).super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    CMU462::HDRImageBuffer::resize(this,(long)local_1078.width,(long)local_1078.height);
    if ((int)((long)local_1078.height * (long)local_1078.width) != 0) {
      puVar3 = local_1078.images[2];
      puVar4 = *local_1078.images;
      puVar5 = local_1078.images[1];
      pfVar10 = &((this->data).
                  super__Vector_base<CMU462::Spectrum,_std::allocator<CMU462::Spectrum>_>._M_impl.
                  super__Vector_impl_data._M_start)->b;
      lVar9 = 0;
      do {
        fVar1 = *(float *)(puVar5 + lVar9 * 4);
        fVar2 = *(float *)(puVar4 + lVar9 * 4);
        ((Spectrum *)(pfVar10 + -2))->r = *(float *)(puVar3 + lVar9 * 4);
        pfVar10[-1] = fVar1;
        *pfVar10 = fVar2;
        lVar9 = lVar9 + 1;
        pfVar10 = pfVar10 + 3;
      } while ((long)local_1078.height * (long)local_1078.width - lVar9 != 0);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[Scotty3D] ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error parsing OpenEXR file: ",0x1c);
    if (local_1080 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x32ec00);
    }
    else {
      sVar7 = strlen(local_1080);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1080,sVar7);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    this = (HDRImageBuffer *)0x0;
  }
  return this;
}

Assistant:

HDRImageBuffer* load_exr(const char* file_path) {
  const char* err;

  EXRImage exr;
  InitEXRImage(&exr);

  int ret = ParseMultiChannelEXRHeaderFromFile(&exr, file_path, &err);
  if (ret != 0) {
    msg("Error parsing OpenEXR file: " << err);
    return NULL;
  }

  for (int i = 0; i < exr.num_channels; i++) {
    if (exr.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  ret = LoadMultiChannelEXRFromFile(&exr, file_path, &err);
  if (ret != 0) {
    msg("Error loading OpenEXR file: " << err);
    exit(EXIT_FAILURE);
  }

  HDRImageBuffer* envmap = new HDRImageBuffer();
  envmap->resize(exr.width, exr.height);
  float* channel_r = (float*)exr.images[2];
  float* channel_g = (float*)exr.images[1];
  float* channel_b = (float*)exr.images[0];
  for (size_t i = 0; i < exr.width * exr.height; i++) {
    envmap->data[i] = Spectrum(channel_r[i], channel_g[i], channel_b[i]);
  }

  return envmap;
}